

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O3

void server_ping_all(void *server_void)

{
  undefined8 *puVar1;
  EOClient *this;
  pair<unsigned_short,_unsigned_char> pVar2;
  PacketBuilder builder;
  PacketBuilder PStack_58;
  
  for (puVar1 = *(undefined8 **)((long)server_void + 0x38);
      puVar1 != (undefined8 *)((long)server_void + 0x38); puVar1 = (undefined8 *)*puVar1) {
    this = (EOClient *)puVar1[2];
    if (this->needpong == true) {
      Client::Close((Client *)this,false);
    }
    else {
      EOClient::PingNewSequence(this);
      pVar2 = EOClient::GetSeqUpdateBytes(this);
      PacketBuilder::PacketBuilder(&PStack_58,PACKET_CONNECTION,PACKET_PLAYER,3);
      PacketBuilder::AddShort(&PStack_58,(uint)pVar2 & 0xffff);
      PacketBuilder::AddChar(&PStack_58,(uint)pVar2 >> 0x10 & 0xff);
      this->needpong = true;
      EOClient::Send(this,&PStack_58);
      PacketBuilder::~PacketBuilder(&PStack_58);
    }
  }
  return;
}

Assistant:

void server_ping_all(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (client->needpong)
		{
			client->Close();
		}
		else
		{
			client->PingNewSequence();
			auto seq_bytes = client->GetSeqUpdateBytes();

			PacketBuilder builder(PACKET_CONNECTION, PACKET_PLAYER, 3);
			builder.AddShort(seq_bytes.first);
			builder.AddChar(seq_bytes.second);

			client->needpong = true;
			client->Send(builder);
		}
	}
}